

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte bVar1;
  stbi_uc sVar2;
  stbi__context *psVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  stbi_uc *psVar11;
  bool bVar12;
  int local_9c;
  int i_1;
  stbi_uc *cur_2;
  byte *pbStack_88;
  stbi_uc scale;
  stbi_uc *in;
  stbi_uc *cur_1;
  int nk;
  int width;
  int filter_bytes;
  int filter;
  stbi_uc *prior;
  stbi_uc *cur;
  int local_50;
  int img_n;
  int k;
  stbi__uint32 img_width_bytes;
  stbi__uint32 img_len;
  stbi__uint32 stride;
  stbi__uint32 j;
  stbi__uint32 i;
  stbi__context *s;
  stbi__uint32 y_local;
  stbi__uint32 x_local;
  int out_n_local;
  stbi__uint32 raw_len_local;
  stbi_uc *raw_local;
  stbi__png *a_local;
  
  psVar3 = a->s;
  uVar5 = x * out_n;
  iVar8 = psVar3->img_n;
  bVar12 = true;
  if (out_n != psVar3->img_n) {
    bVar12 = out_n == psVar3->img_n + 1;
  }
  if (bVar12) {
    psVar11 = (stbi_uc *)stbi__malloc((ulong)(x * y * out_n));
    a->out = psVar11;
    if (a->out == (stbi_uc *)0x0) {
      a_local._4_4_ = stbi__err("Out of memory");
    }
    else {
      uVar6 = iVar8 * x * depth + 7 >> 3;
      uVar7 = (uVar6 + 1) * y;
      if ((psVar3->img_x == x) && (psVar3->img_y == y)) {
        if (raw_len != uVar7) {
          iVar8 = stbi__err("Corrupt PNG");
          return iVar8;
        }
      }
      else if (raw_len < uVar7) {
        iVar8 = stbi__err("Corrupt PNG");
        return iVar8;
      }
      _out_n_local = raw;
      for (img_len = 0; img_len < y; img_len = img_len + 1) {
        _filter_bytes = a->out + uVar5 * img_len;
        width = (int)*_out_n_local;
        if (4 < (uint)width) {
          iVar8 = stbi__err("Corrupt PNG");
          return iVar8;
        }
        cur_1._4_4_ = x;
        nk = iVar8;
        prior = _filter_bytes;
        if (depth < 8) {
          if (x < uVar6) {
            __assert_fail("img_width_bytes <= x",
                          "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                          ,0xf94,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          prior = _filter_bytes + (x * out_n - uVar6);
          nk = 1;
          cur_1._4_4_ = uVar6;
        }
        if (img_len == 0) {
          width = (int)first_row_filter[width];
        }
        for (local_50 = 0; local_50 < nk; local_50 = local_50 + 1) {
          switch(width) {
          case 0:
            prior[local_50] = _out_n_local[(long)local_50 + 1];
            break;
          case 1:
            prior[local_50] = _out_n_local[(long)local_50 + 1];
            break;
          case 2:
            prior[local_50] =
                 _out_n_local[(long)local_50 + 1] + _filter_bytes[(long)local_50 - (ulong)uVar5];
            break;
          case 3:
            prior[local_50] =
                 _out_n_local[(long)local_50 + 1] +
                 (char)((int)(uint)_filter_bytes[(long)local_50 - (ulong)uVar5] >> 1);
            break;
          case 4:
            bVar1 = _out_n_local[(long)local_50 + 1];
            iVar9 = stbi__paeth(0,(uint)_filter_bytes[(long)local_50 - (ulong)uVar5],0);
            prior[local_50] = bVar1 + (char)iVar9;
            break;
          case 5:
            prior[local_50] = _out_n_local[(long)local_50 + 1];
            break;
          case 6:
            prior[local_50] = _out_n_local[(long)local_50 + 1];
          }
        }
        if (depth == 8) {
          if (iVar8 != out_n) {
            prior[iVar8] = 0xff;
          }
          _out_n_local = _out_n_local + (long)iVar8 + 1;
          prior = prior + out_n;
          lVar4 = (long)out_n - (ulong)uVar5;
        }
        else {
          _out_n_local = _out_n_local + 2;
          prior = prior + 1;
          lVar4 = 1 - (ulong)uVar5;
        }
        _filter_bytes = _filter_bytes + lVar4;
        if ((depth < 8) || (iVar8 == out_n)) {
          iVar9 = (cur_1._4_4_ - 1) * iVar8;
          switch(width) {
          case 0:
            memcpy(prior,_out_n_local,(long)iVar9);
            break;
          case 1:
            for (local_50 = 0; local_50 < iVar9; local_50 = local_50 + 1) {
              prior[local_50] = _out_n_local[local_50] + prior[local_50 - nk];
            }
            break;
          case 2:
            for (local_50 = 0; local_50 < iVar9; local_50 = local_50 + 1) {
              prior[local_50] = _out_n_local[local_50] + _filter_bytes[local_50];
            }
            break;
          case 3:
            for (local_50 = 0; local_50 < iVar9; local_50 = local_50 + 1) {
              prior[local_50] =
                   _out_n_local[local_50] +
                   (char)((int)((uint)_filter_bytes[local_50] + (uint)prior[local_50 - nk]) >> 1);
            }
            break;
          case 4:
            for (local_50 = 0; local_50 < iVar9; local_50 = local_50 + 1) {
              bVar1 = _out_n_local[local_50];
              iVar10 = stbi__paeth((uint)prior[local_50 - nk],(uint)_filter_bytes[local_50],
                                   (uint)_filter_bytes[local_50 - nk]);
              prior[local_50] = bVar1 + (char)iVar10;
            }
            break;
          case 5:
            for (local_50 = 0; local_50 < iVar9; local_50 = local_50 + 1) {
              prior[local_50] =
                   _out_n_local[local_50] + (char)((int)(uint)prior[local_50 - nk] >> 1);
            }
            break;
          case 6:
            for (local_50 = 0; local_50 < iVar9; local_50 = local_50 + 1) {
              bVar1 = _out_n_local[local_50];
              iVar10 = stbi__paeth((uint)prior[local_50 - nk],0,0);
              prior[local_50] = bVar1 + (char)iVar10;
            }
          }
          _out_n_local = _out_n_local + iVar9;
        }
        else {
          if (iVar8 + 1 != out_n) {
            __assert_fail("img_n+1 == out_n",
                          "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                          ,0xfc9,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          switch(width) {
          case 0:
            stride = x - 1;
            while (stride != 0) {
              for (local_50 = 0; local_50 < iVar8; local_50 = local_50 + 1) {
                prior[local_50] = _out_n_local[local_50];
              }
              stride = stride - 1;
              prior[iVar8] = 0xff;
              _out_n_local = _out_n_local + iVar8;
              prior = prior + out_n;
            }
            break;
          case 1:
            stride = x - 1;
            while (stride != 0) {
              for (local_50 = 0; local_50 < iVar8; local_50 = local_50 + 1) {
                prior[local_50] = _out_n_local[local_50] + prior[local_50 - out_n];
              }
              stride = stride - 1;
              prior[iVar8] = 0xff;
              _out_n_local = _out_n_local + iVar8;
              prior = prior + out_n;
            }
            break;
          case 2:
            stride = x - 1;
            while (stride != 0) {
              for (local_50 = 0; local_50 < iVar8; local_50 = local_50 + 1) {
                prior[local_50] = _out_n_local[local_50] + _filter_bytes[local_50];
              }
              stride = stride - 1;
              prior[iVar8] = 0xff;
              _out_n_local = _out_n_local + iVar8;
              prior = prior + out_n;
              _filter_bytes = _filter_bytes + out_n;
            }
            break;
          case 3:
            stride = x - 1;
            while (stride != 0) {
              for (local_50 = 0; local_50 < iVar8; local_50 = local_50 + 1) {
                prior[local_50] =
                     _out_n_local[local_50] +
                     (char)((int)((uint)_filter_bytes[local_50] + (uint)prior[local_50 - out_n]) >>
                           1);
              }
              stride = stride - 1;
              prior[iVar8] = 0xff;
              _out_n_local = _out_n_local + iVar8;
              prior = prior + out_n;
              _filter_bytes = _filter_bytes + out_n;
            }
            break;
          case 4:
            stride = x - 1;
            while (stride != 0) {
              for (local_50 = 0; local_50 < iVar8; local_50 = local_50 + 1) {
                bVar1 = _out_n_local[local_50];
                iVar9 = stbi__paeth((uint)prior[local_50 - out_n],(uint)_filter_bytes[local_50],
                                    (uint)_filter_bytes[local_50 - out_n]);
                prior[local_50] = bVar1 + (char)iVar9;
              }
              stride = stride - 1;
              prior[iVar8] = 0xff;
              _out_n_local = _out_n_local + iVar8;
              prior = prior + out_n;
              _filter_bytes = _filter_bytes + out_n;
            }
            break;
          case 5:
            stride = x - 1;
            while (stride != 0) {
              for (local_50 = 0; local_50 < iVar8; local_50 = local_50 + 1) {
                prior[local_50] =
                     _out_n_local[local_50] + (char)((int)(uint)prior[local_50 - out_n] >> 1);
              }
              stride = stride - 1;
              prior[iVar8] = 0xff;
              _out_n_local = _out_n_local + iVar8;
              prior = prior + out_n;
            }
            break;
          case 6:
            stride = x - 1;
            while (stride != 0) {
              for (local_50 = 0; local_50 < iVar8; local_50 = local_50 + 1) {
                bVar1 = _out_n_local[local_50];
                iVar9 = stbi__paeth((uint)prior[local_50 - out_n],0,0);
                prior[local_50] = bVar1 + (char)iVar9;
              }
              stride = stride - 1;
              prior[iVar8] = 0xff;
              _out_n_local = _out_n_local + iVar8;
              prior = prior + out_n;
            }
          }
        }
      }
      if (depth < 8) {
        for (img_len = 0; img_len < y; img_len = img_len + 1) {
          in = a->out + uVar5 * img_len;
          pbStack_88 = a->out + (((ulong)(x * out_n) + (ulong)(uVar5 * img_len)) - (ulong)uVar6);
          if (color == 0) {
            sVar2 = stbi__depth_scale_table[depth];
          }
          else {
            sVar2 = '\x01';
          }
          if (depth == 4) {
            for (local_50 = x * iVar8; 1 < local_50; local_50 = local_50 + -2) {
              psVar11 = in + 1;
              *in = sVar2 * (char)((int)(uint)*pbStack_88 >> 4);
              in = in + 2;
              *psVar11 = sVar2 * (*pbStack_88 & 0xf);
              pbStack_88 = pbStack_88 + 1;
            }
            if (0 < local_50) {
              *in = sVar2 * (char)((int)(uint)*pbStack_88 >> 4);
            }
          }
          else if (depth == 2) {
            for (local_50 = x * iVar8; 3 < local_50; local_50 = local_50 + -4) {
              *in = sVar2 * (char)((int)(uint)*pbStack_88 >> 6);
              in[1] = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 4) & 3);
              psVar11 = in + 3;
              in[2] = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 2) & 3);
              in = in + 4;
              *psVar11 = sVar2 * (*pbStack_88 & 3);
              pbStack_88 = pbStack_88 + 1;
            }
            if (0 < local_50) {
              *in = sVar2 * (char)((int)(uint)*pbStack_88 >> 6);
              in = in + 1;
            }
            if (1 < local_50) {
              *in = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 4) & 3);
              in = in + 1;
            }
            if (2 < local_50) {
              *in = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 2) & 3);
            }
          }
          else if (depth == 1) {
            for (local_50 = x * iVar8; 7 < local_50; local_50 = local_50 + -8) {
              *in = sVar2 * (char)((int)(uint)*pbStack_88 >> 7);
              in[1] = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 6) & 1);
              in[2] = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 5) & 1);
              in[3] = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 4) & 1);
              in[4] = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 3) & 1);
              in[5] = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 2) & 1);
              psVar11 = in + 7;
              in[6] = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 1) & 1);
              in = in + 8;
              *psVar11 = sVar2 * (*pbStack_88 & 1);
              pbStack_88 = pbStack_88 + 1;
            }
            if (0 < local_50) {
              *in = sVar2 * (char)((int)(uint)*pbStack_88 >> 7);
              in = in + 1;
            }
            if (1 < local_50) {
              *in = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 6) & 1);
              in = in + 1;
            }
            if (2 < local_50) {
              *in = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 5) & 1);
              in = in + 1;
            }
            if (3 < local_50) {
              *in = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 4) & 1);
              in = in + 1;
            }
            if (4 < local_50) {
              *in = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 3) & 1);
              in = in + 1;
            }
            if (5 < local_50) {
              *in = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 2) & 1);
              in = in + 1;
            }
            if (6 < local_50) {
              *in = sVar2 * ((byte)((int)(uint)*pbStack_88 >> 1) & 1);
            }
          }
          if (iVar8 != out_n) {
            psVar11 = a->out;
            uVar7 = uVar5 * img_len;
            if (iVar8 == 1) {
              for (local_9c = x - 1; -1 < local_9c; local_9c = local_9c + -1) {
                psVar11[(long)(local_9c * 2 + 1) + (ulong)uVar7] = 0xff;
                psVar11[(long)(local_9c << 1) + (ulong)uVar7] =
                     psVar11[(long)local_9c + (ulong)uVar7];
              }
            }
            else {
              if (iVar8 != 3) {
                __assert_fail("img_n == 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                              ,0x1019,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              for (local_9c = x - 1; -1 < local_9c; local_9c = local_9c + -1) {
                psVar11[(long)(local_9c * 4 + 3) + (ulong)uVar7] = 0xff;
                psVar11[(long)(local_9c * 4 + 2) + (ulong)uVar7] =
                     psVar11[(long)(local_9c * 3 + 2) + (ulong)uVar7];
                psVar11[(long)(local_9c * 4 + 1) + (ulong)uVar7] =
                     psVar11[(long)(local_9c * 3 + 1) + (ulong)uVar7];
                psVar11[(long)(local_9c << 2) + (ulong)uVar7] =
                     psVar11[(long)(local_9c * 3) + (ulong)uVar7];
              }
            }
          }
        }
      }
      a_local._4_4_ = 1;
    }
    return a_local._4_4_;
  }
  __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                ,0xf7e,
                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
               );
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}